

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_bool j2k_set_decode_area(opj_j2k_v2_t *p_j2k,opj_image_t *p_image,OPJ_INT32 p_start_x,
                            OPJ_INT32 p_start_y,OPJ_INT32 p_end_x,OPJ_INT32 p_end_y,
                            opj_event_mgr *p_manager)

{
  byte *pbVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  opj_image_t *poVar6;
  OPJ_UINT32 OVar7;
  OPJ_UINT32 OVar8;
  undefined8 in_RAX;
  byte bVar9;
  ulong uVar10;
  char *fmt;
  int iVar11;
  ulong uVar12;
  opj_image_comp_t *poVar13;
  uint uVar14;
  uint uVar15;
  opj_bool oVar16;
  undefined4 uVar17;
  
  uVar17 = (undefined4)((ulong)in_RAX >> 0x20);
  if ((p_j2k->m_specific_param).m_decoder.m_state != 8) {
    opj_event_msg_v2(p_manager,1,
                     "Need to decode the main header before begin to decode the remaining codestream"
                    );
    return 0;
  }
  uVar10 = (ulong)(uint)p_start_x;
  if (((p_start_y == 0 && p_start_x == 0) && p_end_x == 0) && p_end_y == 0) {
    opj_event_msg_v2(p_manager,4,
                     "No decoded area parameters, set the decoded area to the whole image\n");
    *(undefined8 *)((long)&p_j2k->m_specific_param + 0x20) = 0;
    (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = *(OPJ_BYTE **)&(p_j2k->m_cp).tw;
LAB_00122da1:
    oVar16 = 1;
  }
  else {
    poVar6 = p_j2k->m_private_image;
    uVar12 = (ulong)poVar6->x1;
    if (poVar6->x1 < (uint)p_start_x) {
      fmt = 
      "Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n";
    }
    else {
      if ((uint)p_start_x < poVar6->x0) {
        opj_event_msg_v2(p_manager,2,
                         "Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n"
                        );
        (p_j2k->m_specific_param).m_decoder.m_start_tile_x = 0;
        p_start_x = poVar6->x0;
      }
      else {
        (p_j2k->m_specific_param).m_decoder.m_start_tile_x =
             (p_start_x - (p_j2k->m_cp).tx0) / (p_j2k->m_cp).tdx;
      }
      p_image->x0 = p_start_x;
      uVar12 = (ulong)poVar6->y1;
      if (poVar6->y1 < (uint)p_start_y) {
        fmt = 
        "Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n";
        uVar10 = (ulong)(uint)p_start_y;
      }
      else {
        if ((uint)p_start_y < poVar6->y0) {
          opj_event_msg_v2(p_manager,2,
                           "Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n"
                           ,(ulong)(uint)p_start_y);
          (p_j2k->m_specific_param).m_decoder.m_start_tile_y = 0;
          p_start_y = poVar6->y0;
        }
        else {
          (p_j2k->m_specific_param).m_decoder.m_start_tile_y =
               (p_start_y - (p_j2k->m_cp).ty0) / (p_j2k->m_cp).tdy;
        }
        p_image->y0 = p_start_y;
        uVar12 = (ulong)poVar6->x0;
        if ((uint)p_end_x < poVar6->x0) {
          fmt = 
          "Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n"
          ;
          uVar10 = (ulong)(uint)p_end_x;
        }
        else {
          if (poVar6->x1 < (uint)p_end_x) {
            opj_event_msg_v2(p_manager,2,
                             "Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n"
                             ,(ulong)(uint)p_end_x);
            (p_j2k->m_specific_param).m_decoder.m_end_tile_x = (p_j2k->m_cp).tw;
            p_end_x = poVar6->x1;
          }
          else {
            OVar3 = (p_j2k->m_cp).tdx;
            (p_j2k->m_specific_param).m_decoder.m_end_tile_x =
                 (int)(~(p_j2k->m_cp).tx0 + p_end_x + OVar3) / (int)OVar3;
          }
          p_image->x1 = p_end_x;
          uVar12 = (ulong)poVar6->y0;
          if (poVar6->y0 <= (uint)p_end_y) {
            if (poVar6->y1 < (uint)p_end_y) {
              opj_event_msg_v2(p_manager,2,
                               "Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n"
                               ,(ulong)(uint)p_end_y);
              (p_j2k->m_specific_param).m_decoder.m_end_tile_y = (p_j2k->m_cp).th;
              p_end_y = poVar6->y1;
            }
            else {
              OVar3 = (p_j2k->m_cp).tdy;
              (p_j2k->m_specific_param).m_decoder.m_end_tile_y =
                   (int)(~(p_j2k->m_cp).ty0 + p_end_y + OVar3) / (int)OVar3;
            }
            p_image->y1 = p_end_y;
            pbVar1 = (byte *)((long)&p_j2k->m_specific_param + 0x54);
            *pbVar1 = *pbVar1 | 2;
            poVar13 = p_image->comps;
            uVar2 = p_image->x0;
            OVar3 = p_image->numcomps;
            for (uVar14 = 0; OVar3 != uVar14; uVar14 = uVar14 + 1) {
              OVar4 = poVar13->dx;
              OVar5 = poVar13->dy;
              OVar7 = (int)(OVar4 + uVar2 + -1) / (int)OVar4;
              poVar13->x0 = OVar7;
              OVar8 = (int)(p_image->y0 + (OVar5 - 1)) / (int)OVar5;
              poVar13->y0 = OVar8;
              bVar9 = (byte)poVar13->factor;
              iVar11 = -1 << (bVar9 & 0x1f);
              uVar15 = ((int)(iVar11 - OVar7) >> (bVar9 & 0x1f)) -
                       (iVar11 - (int)((OVar4 - 1) + p_image->x1) / (int)OVar4 >> (bVar9 & 0x1f));
              if ((int)uVar15 < 0) {
                fmt = "Size x of the decoded component image is incorrect (comp[%d].w=%d).\n";
                uVar10 = (ulong)uVar14;
                uVar12 = (ulong)uVar15;
                goto LAB_0012302c;
              }
              OVar4 = p_image->y1;
              poVar13->w = uVar15;
              uVar15 = ((int)(iVar11 - OVar8) >> (bVar9 & 0x1f)) -
                       (iVar11 - (int)((OVar5 - 1) + OVar4) / (int)OVar5 >> (bVar9 & 0x1f));
              uVar12 = (ulong)uVar15;
              if ((int)uVar15 < 0) {
                fmt = "Size y of the decoded component image is incorrect (comp[%d].h=%d).\n";
                uVar10 = (ulong)uVar14;
                goto LAB_0012302c;
              }
              poVar13->h = uVar15;
              poVar13 = poVar13 + 1;
            }
            opj_event_msg_v2(p_manager,4,"Setting decoding area to %d,%d,%d,%d\n",(ulong)uVar2,
                             (ulong)p_image->y0,(ulong)p_image->x1,CONCAT44(uVar17,p_image->y1));
            goto LAB_00122da1;
          }
          fmt = 
          "Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n"
          ;
          uVar10 = (ulong)(uint)p_end_y;
        }
      }
    }
LAB_0012302c:
    oVar16 = 0;
    opj_event_msg_v2(p_manager,1,fmt,uVar10,uVar12);
  }
  return oVar16;
}

Assistant:

opj_bool j2k_set_decode_area(	opj_j2k_v2_t *p_j2k,
								opj_image_t* p_image,
								OPJ_INT32 p_start_x, OPJ_INT32 p_start_y,
								OPJ_INT32 p_end_x, OPJ_INT32 p_end_y,
								struct opj_event_mgr * p_manager )
{
	opj_cp_v2_t * l_cp = &(p_j2k->m_cp);
	opj_image_t * l_image = p_j2k->m_private_image;

	OPJ_UINT32 it_comp;
	OPJ_INT32 l_comp_x1, l_comp_y1;
	opj_image_comp_t* l_img_comp = NULL;

	/* Check if we are read the main header */
	if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT) { /* FIXME J2K_DEC_STATE_TPHSOT)*/
		opj_event_msg_v2(p_manager, EVT_ERROR, "Need to decode the main header before begin to decode the remaining codestream");
		return OPJ_FALSE;
	}

	if ( !p_start_x && !p_start_y && !p_end_x && !p_end_y){
		opj_event_msg_v2(p_manager, EVT_INFO, "No decoded area parameters, set the decoded area to the whole image\n");

		p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;

		return OPJ_TRUE;
	}

	/* ----- */
	/* Check if the positions provided by the user are correct */

	/* Left */
	if (p_start_x > l_image->x1 ) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n",
			p_start_x, l_image->x1);
		return OPJ_FALSE;
	}
	else if (p_start_x < l_image->x0){
		opj_event_msg_v2(p_manager, EVT_WARNING,
				"Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n",
				p_start_x, l_image->x0);
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
		p_image->x0 = l_image->x0;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = (p_start_x - l_cp->tx0) / l_cp->tdx;
		p_image->x0 = p_start_x;
	}

	/* Up */
	if (p_start_y > l_image->y1){
		opj_event_msg_v2(p_manager, EVT_ERROR,
				"Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n",
				p_start_y, l_image->y1);
		return OPJ_FALSE;
	}
	else if (p_start_y < l_image->y0){
		opj_event_msg_v2(p_manager, EVT_WARNING,
				"Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n",
				p_start_y, l_image->y0);
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
		p_image->y0 = l_image->y0;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = (p_start_y - l_cp->ty0) / l_cp->tdy;
		p_image->y0 = p_start_y;
	}

	/* Right */
	if (p_end_x < l_image->x0) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n",
			p_end_x, l_image->x0);
		return OPJ_FALSE;
	}
	else if (p_end_x > l_image->x1) {
		opj_event_msg_v2(p_manager, EVT_WARNING,
			"Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n",
			p_end_x, l_image->x1);
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
		p_image->x1 = l_image->x1;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = int_ceildiv((p_end_x - l_cp->tx0), l_cp->tdx);
		p_image->x1 = p_end_x;
	}

	/* Bottom */
	if (p_end_y < l_image->y0) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n",
			p_end_y, l_image->y0);
		return OPJ_FALSE;
	}
	if (p_end_y > l_image->y1){
		opj_event_msg_v2(p_manager, EVT_WARNING,
			"Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n",
			p_end_y, l_image->y1);
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;
		p_image->y1 = l_image->y1;
	}
	else{
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = int_ceildiv((p_end_y - l_cp->ty0), l_cp->tdy);
		p_image->y1 = p_end_y;
	}
	/* ----- */

	p_j2k->m_specific_param.m_decoder.m_discard_tiles = 1;

	l_img_comp = p_image->comps;
	for (it_comp=0; it_comp < p_image->numcomps; ++it_comp)
	{
		OPJ_INT32 l_h,l_w;

		l_img_comp->x0 = int_ceildiv(p_image->x0, l_img_comp->dx);
		l_img_comp->y0 = int_ceildiv(p_image->y0, l_img_comp->dy);
		l_comp_x1 = int_ceildiv(p_image->x1, l_img_comp->dx);
		l_comp_y1 = int_ceildiv(p_image->y1, l_img_comp->dy);

		l_w = int_ceildivpow2(l_comp_x1, l_img_comp->factor)
				- int_ceildivpow2(l_img_comp->x0, l_img_comp->factor);
		if (l_w < 0){
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"Size x of the decoded component image is incorrect (comp[%d].w=%d).\n",
				it_comp, l_w);
			return OPJ_FALSE;
		}
		l_img_comp->w = l_w;

		l_h = int_ceildivpow2(l_comp_y1, l_img_comp->factor)
				- int_ceildivpow2(l_img_comp->y0, l_img_comp->factor);
		if (l_h < 0){
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"Size y of the decoded component image is incorrect (comp[%d].h=%d).\n",
				it_comp, l_h);
			return OPJ_FALSE;
		}
		l_img_comp->h = l_h;

		l_img_comp++;
	}

	opj_event_msg_v2( p_manager, EVT_INFO,"Setting decoding area to %d,%d,%d,%d\n",
			p_image->x0, p_image->y0, p_image->x1, p_image->y1);


	return OPJ_TRUE;
}